

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall
QtPrivate::QCalendarDateValidator::handleKeyEvent
          (QCalendarDateValidator *this,long keyEvent,undefined8 param_3)

{
  uint uVar1;
  Section SVar2;
  reference pvVar3;
  
  if (this->m_currentToken < 0) {
    return;
  }
  uVar1 = *(uint *)(keyEvent + 0x40);
  if (this->m_lastSectionMove == NextSection) {
    if (uVar1 == 0x1000061) {
LAB_003a3bab:
      toPreviousToken(this);
      goto LAB_003a3b79;
    }
    if (uVar1 == 0x1000012) goto LAB_003a3bbf;
    if (uVar1 != 0x1000014) {
      if (uVar1 != 0x1000003) goto LAB_003a3bc7;
      goto LAB_003a3bab;
    }
  }
  else {
LAB_003a3b79:
    if (uVar1 == 0x1000012) {
LAB_003a3bbf:
      toPreviousToken(this);
      goto LAB_003a3bc7;
    }
    if (uVar1 != 0x1000014) goto LAB_003a3bc7;
  }
  toNextToken(this);
LAB_003a3bc7:
  pvVar3 = std::vector<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>::
           operator[](&this->m_tokens,(long)this->m_currentToken);
  SVar2 = (*pvVar3->validator->_vptr_QCalendarDateSectionValidator[2])
                    (pvVar3->validator,(ulong)uVar1);
  this->m_lastSectionMove = SVar2;
  applyToDate(this,param_3);
  if (this->m_lastSectionMove == PrevSection) {
    toPreviousToken(this);
    return;
  }
  if (this->m_lastSectionMove != NextSection) {
    return;
  }
  toNextToken(this);
  return;
}

Assistant:

void QCalendarDateValidator::handleKeyEvent(QKeyEvent *keyEvent,QCalendar cal)
{
    if (m_currentToken < 0)
        return;

    int key = keyEvent->key();
    if (m_lastSectionMove == QCalendarDateSectionValidator::NextSection) {
        if (key == Qt::Key_Back || key == Qt::Key_Backspace)
            toPreviousToken();
    }
    if (key == Qt::Key_Right)
        toNextToken();
    else if (key == Qt::Key_Left)
        toPreviousToken();

    m_lastSectionMove = m_tokens[m_currentToken].validator->handleKey(key);

    applyToDate(cal);
    if (m_lastSectionMove == QCalendarDateSectionValidator::NextSection)
        toNextToken();
    else if (m_lastSectionMove == QCalendarDateSectionValidator::PrevSection)
        toPreviousToken();
}